

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O0

int __thiscall pool_layer_t::normalize_range(pool_layer_t *this,float f,int max,bool lim_min)

{
  byte in_DL;
  int in_ESI;
  float in_XMM0_Da;
  double dVar1;
  undefined4 local_4;
  
  if (0.0 < in_XMM0_Da) {
    local_4 = in_ESI + -1;
    if (in_XMM0_Da < (float)local_4) {
      if ((in_DL & 1) == 0) {
        dVar1 = std::floor((double)(ulong)(uint)in_XMM0_Da);
        local_4 = (int)SUB84(dVar1,0);
      }
      else {
        dVar1 = std::ceil((double)(ulong)(uint)in_XMM0_Da);
        local_4 = (int)SUB84(dVar1,0);
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int normalize_range(float f, int max, bool lim_min) {
    if (f <= 0)
      return 0;
    max -= 1;
    if (f >= max)
      return max;

    if (lim_min) // left side of inequality
      return ceil(f);
    else
      return floor(f);
  }